

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMFormat.hh
# Opt level: O0

Float_Size OpenMesh::IO::OMFormat::float_size<unsigned_char>(uchar *d)

{
  bool bVar1;
  uchar *d_local;
  
  bVar1 = is_float<unsigned_char>(d);
  if (!bVar1) {
    __assert_fail("is_float(d)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./OpenMesh/Core/IO/OMFormat.hh"
                  ,0x1a3,
                  "Chunk::Float_Size OpenMesh::IO::OMFormat::float_size(const T &) [T = unsigned char]"
                 );
  }
  std::operator<<((ostream *)&std::cerr,"Invalid value in float_size\n");
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./OpenMesh/Core/IO/OMFormat.hh"
                ,0x1ac,
                "Chunk::Float_Size OpenMesh::IO::OMFormat::float_size(const T &) [T = unsigned char]"
               );
}

Assistant:

Chunk::Float_Size float_size(const T& d)
#endif
  {
    assert( is_float(d) );

    switch( sizeof(T) )
    {
      case  4: return OMFormat::Chunk::Float_32;
      case  8: return OMFormat::Chunk::Float_64;
      case 16: return OMFormat::Chunk::Float_128;
      default:
        std::cerr << "Invalid value in float_size\n";
        assert( false );
        break;
    }
    return Chunk::Float_Size(0);
  }